

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapValues.cpp
# Opt level: O0

void TTD::NSSnapValues::InflateSnapPrimitiveValue
               (SnapPrimitiveValue *snapValue,InflateMap *inflator)

{
  TTD_PTR_ID objid;
  ScriptContext *this;
  JavascriptLibrary *this_00;
  RecyclableObject *value;
  JavascriptBoolean *local_48;
  RecyclableObject *rObj;
  Var res;
  JavascriptLibrary *jslib;
  ScriptContext *ctx;
  InflateMap *inflator_local;
  SnapPrimitiveValue *snapValue_local;
  
  this = InflateMap::LookupScriptContext(inflator,snapValue->SnapType->ScriptContextLogId);
  this_00 = Js::ScriptContext::GetLibrary(this);
  if (snapValue->OptWellKnownToken == (TTD_WELLKNOWN_TOKEN)0x0) {
    rObj = InflateMap::FindReusableObjectIfExists(inflator,snapValue->PrimitiveValueId);
    if (rObj == (RecyclableObject *)0x0) {
      switch(snapValue->SnapType->JsTypeId) {
      case TypeIds_Undefined:
        rObj = Js::JavascriptLibraryBase::GetUndefined(&this_00->super_JavascriptLibraryBase);
        break;
      case TypeIds_Null:
        rObj = Js::JavascriptLibraryBase::GetNull(&this_00->super_JavascriptLibraryBase);
        break;
      case TypeIds_Boolean:
        if ((snapValue->field_3).u_boolValue == 0) {
          local_48 = Js::JavascriptLibraryBase::GetFalse(&this_00->super_JavascriptLibraryBase);
        }
        else {
          local_48 = Js::JavascriptLibraryBase::GetTrue(&this_00->super_JavascriptLibraryBase);
        }
        rObj = &local_48->super_RecyclableObject;
        break;
      default:
        TTDAbort_unrecoverable_error
                  ("These are supposed to be primitive values e.g., no pointers or properties.");
      case TypeIds_Number:
        rObj = (RecyclableObject *)
               Js::JavascriptNumber::ToVarWithCheck((snapValue->field_3).u_doubleValue,this);
        break;
      case TypeIds_Int64Number:
        rObj = (RecyclableObject *)
               Js::JavascriptTypedNumber<long>::ToVar((snapValue->field_3).u_int64Value,this);
        break;
      case TypeIds_LastNumberType:
        rObj = (RecyclableObject *)
               Js::JavascriptTypedNumber<unsigned_long>::ToVar
                         ((snapValue->field_3).u_uint64Value,this);
        break;
      case TypeIds_String:
        rObj = &Js::JavascriptString::NewCopyBuffer
                          (((snapValue->field_3).u_stringValue)->Contents,
                           ((snapValue->field_3).u_stringValue)->Length,this)->
                super_RecyclableObject;
        break;
      case TypeIds_Symbol:
        rObj = Js::JavascriptLibrary::CreatePrimitveSymbol_TTD
                         (this_00,(snapValue->field_3).u_propertyIdValue);
      }
    }
  }
  else {
    rObj = RuntimeContextInfo::LookupKnownObjectFromPath
                     (this->TTDWellKnownInfo,snapValue->OptWellKnownToken);
  }
  objid = snapValue->PrimitiveValueId;
  value = Js::VarTo<Js::RecyclableObject>(rObj);
  InflateMap::AddObject(inflator,objid,value);
  return;
}

Assistant:

void InflateSnapPrimitiveValue(const SnapPrimitiveValue* snapValue, InflateMap* inflator)
        {
            Js::ScriptContext* ctx = inflator->LookupScriptContext(snapValue->SnapType->ScriptContextLogId);
            Js::JavascriptLibrary* jslib = ctx->GetLibrary();

            Js::Var res = nullptr;
            if(snapValue->OptWellKnownToken != TTD_INVALID_WELLKNOWN_TOKEN)
            {
                res = ctx->TTDWellKnownInfo->LookupKnownObjectFromPath(snapValue->OptWellKnownToken);
            }
            else
            {
                Js::RecyclableObject* rObj = inflator->FindReusableObjectIfExists(snapValue->PrimitiveValueId);
                if(rObj != nullptr)
                {
                    res = rObj;
                }
                else
                {
                    switch(snapValue->SnapType->JsTypeId)
                    {
                    case Js::TypeIds_Undefined:
                        res = jslib->GetUndefined();
                        break;
                    case Js::TypeIds_Null:
                        res = jslib->GetNull();
                        break;
                    case Js::TypeIds_Boolean:
                        res = (snapValue->u_boolValue ? jslib->GetTrue() : jslib->GetFalse());
                        break;
                    case Js::TypeIds_Number:
                        res = Js::JavascriptNumber::ToVarWithCheck(snapValue->u_doubleValue, ctx);
                        break;
                    case Js::TypeIds_Int64Number:
                        res = Js::JavascriptInt64Number::ToVar(snapValue->u_int64Value, ctx);
                        break;
                    case Js::TypeIds_UInt64Number:
                        res = Js::JavascriptUInt64Number::ToVar(snapValue->u_uint64Value, ctx);
                        break;
                    case Js::TypeIds_String:
                        res = Js::JavascriptString::NewCopyBuffer(snapValue->u_stringValue->Contents, snapValue->u_stringValue->Length, ctx);
                        break;
                    case Js::TypeIds_Symbol:
                        res = jslib->CreatePrimitveSymbol_TTD(snapValue->u_propertyIdValue);
                        break;
                    default:
                        TTDAssert(false, "These are supposed to be primitive values e.g., no pointers or properties.");
                        res = nullptr;
                    }
                }
            }

            inflator->AddObject(snapValue->PrimitiveValueId, Js::VarTo<Js::RecyclableObject>(res));
        }